

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * __thiscall
CMU462::Matrix4x4::operator+(Matrix4x4 *__return_storage_ptr__,Matrix4x4 *this,Matrix4x4 *B)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  undefined4 local_30;
  undefined4 local_2c;
  int j;
  int i;
  Matrix4x4 *A;
  Matrix4x4 *B_local;
  Matrix4x4 *this_local;
  Matrix4x4 *C;
  
  Matrix4x4(__return_storage_ptr__);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      pdVar3 = operator()(this,local_2c,local_30);
      dVar1 = *pdVar3;
      pdVar3 = operator()(B,local_2c,local_30);
      dVar2 = *pdVar3;
      pdVar3 = operator()(__return_storage_ptr__,local_2c,local_30);
      *pdVar3 = dVar1 + dVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::operator+( const Matrix4x4& B ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 C;

    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       C(i,j) = A(i,j) + B(i,j);
    }

    return C;
  }